

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::Private(Private *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  usize uVar4;
  String local_d0;
  String local_a8;
  String local_80;
  String local_58;
  int local_2c;
  int local_28;
  int stderrPipes [2];
  int stdoutPipes [2];
  Private *this_local;
  
  this->valid = false;
  Buffer::Buffer(&this->bufferedInput);
  Buffer::Buffer(&this->bufferedOutput);
  Array<unsigned_int>::Array(&this->prompt);
  Array<unsigned_int>::Array(&this->input);
  List<String>::List(&this->history);
  List<String>::Iterator::Iterator(&this->historyPos);
  if ((originalStdout == -1) && (iVar3 = isatty(0), iVar3 != 0)) {
    this->valid = true;
    originalStdout = eventfd(0,0x80000);
    iVar3 = eventfd(0,0x80000);
    this->originalStderr = iVar3;
    iVar3 = dup3(1,originalStdout,0x80000);
    if ((iVar3 == -1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,0xc3,"dup3(STDOUT_FILENO, originalStdout, O_CLOEXEC) != -1"),
       iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar3 = dup3(2,this->originalStderr,0x80000);
    if ((iVar3 == -1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,0xc4,"dup3(STDERR_FILENO, originalStderr, O_CLOEXEC) != -1"),
       iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar3 = pipe2(stderrPipes,0x80000);
    if ((iVar3 != 0) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,199,"pipe2(stdoutPipes, O_CLOEXEC) == 0"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar3 = pipe2(&local_2c,0x80000);
    if ((iVar3 != 0) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,200,"pipe2(stderrPipes, O_CLOEXEC) == 0"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this->stdoutRead = stderrPipes[0];
    this->stdoutWrite = stderrPipes[1];
    this->stderrRead = local_2c;
    this->stderrWrite = local_28;
    iVar3 = dup2(this->stdoutWrite,1);
    if ((iVar3 == -1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,0xcd,"dup2(stdoutWrite, STDOUT_FILENO) != -1"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar3 = dup2(this->stderrWrite,2);
    if ((iVar3 == -1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,0xce,"dup2(stderrWrite, STDERR_FILENO) != -1"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar3 = setvbuf(_stdout,(char *)0x0,2,0);
    if ((iVar3 != 0) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,0xcf,"setvbuf(stdout, NULL, _IONBF, 0) == 0"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar3 = setvbuf(_stderr,(char *)0x0,2,0);
    if ((iVar3 != 0) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,0xd0,"setvbuf(stderr, NULL, _IONBF, 0) == 0"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if ((originalTermiosValid & 1U) == 0) {
      iVar3 = tcgetattr(originalStdout,(termios *)&originalTermios);
      if ((iVar3 != 0) &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0xd5,"tcgetattr(originalStdout, &originalTermios) == 0"),
         iVar3 != 0)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      originalTermiosValid = true;
      atexit(restoreTermMode);
      memcpy(&this->rawMode,&originalTermios,0x3c);
      cfmakeraw((termios *)&this->rawMode);
      (this->rawMode).c_lflag = (this->rawMode).c_lflag | 1;
      (this->rawMode).c_cc[6] = '\x01';
      (this->rawMode).c_cc[5] = '\0';
      (this->rawMode).c_oflag = (this->rawMode).c_oflag | 1;
      memcpy(&this->noEchoMode,&this->rawMode,0x3c);
      (this->noEchoMode).c_oflag = (this->noEchoMode).c_oflag | 1;
      iVar3 = tcsetattr(originalStdout,1,(termios *)&this->noEchoMode);
      if ((iVar3 != 0) &&
         (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0xe4,"tcsetattr(originalStdout, TCSADRAIN, &noEchoMode) == 0"),
         iVar3 != 0)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    if (resizeEventFd == 0) {
      resizeEventFd = eventfd(0,0x80000);
      signal(0x1c,handleWinch);
    }
    String::String<5ul>(&local_80,(char (*) [5])"LANG");
    String::String(&local_a8);
    Process::getEnvironmentVariable(&local_58,&local_80,&local_a8);
    String::String<7ul>(&local_d0,(char (*) [7])".UTF-8");
    bVar2 = String::endsWith(&local_58,&local_d0);
    this->utf8 = bVar2;
    String::~String(&local_d0);
    String::~String(&local_58);
    String::~String(&local_a8);
    String::~String(&local_80);
    uVar4 = getScreenWidth(this);
    this->stdoutScreenWidth = uVar4;
  }
  return;
}

Assistant:

Private() : valid(false)
  {
#ifdef _MSC_VER
    if(!GetConsoleMode(GetStdHandle(STD_OUTPUT_HANDLE), &consoleOutputMode) ||
       !GetConsoleMode(GetStdHandle(STD_INPUT_HANDLE), &consoleInputMode))
      return; // no tty?
    valid = true;

    // redirect stdout and stderr to pipe
    VERIFY(CreatePipeEx(&hStdOutRead, &hStdOutWrite, NULL, 0, FILE_FLAG_OVERLAPPED, 0));
    VERIFY(CreatePipeEx(&hStdErrRead, &hStdErrWrite, NULL, 0, FILE_FLAG_OVERLAPPED, 0));
    originalStdout = _dup(_fileno(stdout));
    originalStderr = _dup(_fileno(stderr));
    newStdout = _open_osfhandle((intptr_t)hStdOutWrite, _O_BINARY);
    ASSERT(newStdout != -1);
    newStderr = _open_osfhandle((intptr_t)hStdErrWrite, _O_BINARY);
    VERIFY(_dup2(newStdout, _fileno(stdout)) == 0);
    VERIFY(_dup2(newStderr, _fileno(stderr)) == 0);
    VERIFY(setvbuf(stdout, NULL, _IONBF, 0) == 0);
    VERIFY(setvbuf(stderr, NULL, _IONBF, 0) == 0);
    SetStdHandle(STD_OUTPUT_HANDLE, (HANDLE)_get_osfhandle(_fileno(stdout)));
    SetStdHandle(STD_ERROR_HANDLE, (HANDLE)_get_osfhandle(_fileno(stderr)));
    hOriginalStdOut = (HANDLE)_get_osfhandle(originalStdout);
    ASSERT(hOriginalStdOut != INVALID_HANDLE_VALUE);
    hOriginalStdErr = (HANDLE)_get_osfhandle(originalStderr);
    ASSERT(hOriginalStdErr != INVALID_HANDLE_VALUE);

    // initialize overlapped reading of hStdOutRead
    ZeroMemory(&outOverlapped, sizeof(outOverlapped));
    ZeroMemory(&errOverlapped, sizeof(errOverlapped));
    VERIFY(outOverlapped.hEvent = CreateEvent(NULL, TRUE, TRUE, NULL));
    VERIFY(errOverlapped.hEvent = CreateEvent(NULL, TRUE, TRUE, NULL));
    DWORD read;
    while(ReadFile(hStdOutRead, stdoutBuffer, sizeof(stdoutBuffer), &read, &outOverlapped))
    {
      DWORD written;
      VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
      ASSERT(written == read / sizeof(char));
    }
    while(ReadFile(hStdErrRead, stderrBuffer, sizeof(stderrBuffer), &read, &errOverlapped))
    {
      DWORD written;
      VERIFY(WriteFile(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
      ASSERT(written == read / sizeof(char));
    }

    // enable window events
    VERIFY(SetConsoleMode(GetStdHandle(STD_INPUT_HANDLE), consoleInputMode | ENABLE_WINDOW_INPUT));
#else
    if(originalStdout != -1)
      return; // you should not create more than a single instance of this class
    if(!isatty(STDIN_FILENO))
      return;
    valid = true;

#ifdef __CYGWIN__
    originalStdout = open("/dev/null", O_CLOEXEC);
    originalStderr = open("/dev/null", O_CLOEXEC);
#else
    originalStdout = eventfd(0, EFD_CLOEXEC); // create new file descriptor with O_CLOEXEC.. is there a better way to do this?
    originalStderr = eventfd(0, EFD_CLOEXEC); // create new file descriptor with O_CLOEXEC.. is there a better way to do this?
#endif
    VERIFY(dup3(STDOUT_FILENO, originalStdout, O_CLOEXEC) != -1); // create copy of STDOUT_FILENO
    VERIFY(dup3(STDERR_FILENO, originalStderr, O_CLOEXEC) != -1); // create copy of STDERR_FILENO
    int stdoutPipes[2];
    int stderrPipes[2];
    VERIFY(pipe2(stdoutPipes, O_CLOEXEC) == 0);
    VERIFY(pipe2(stderrPipes, O_CLOEXEC) == 0);
    stdoutRead = stdoutPipes[0];
    stdoutWrite = stdoutPipes[1];
    stderrRead = stderrPipes[0];
    stderrWrite = stderrPipes[1];
    VERIFY(dup2(stdoutWrite, STDOUT_FILENO) != -1);
    VERIFY(dup2(stderrWrite, STDERR_FILENO) != -1);
    VERIFY(setvbuf(stdout, NULL, _IONBF, 0) == 0);
    VERIFY(setvbuf(stderr, NULL, _IONBF, 0) == 0);

    // save term mode
    if(!originalTermiosValid)
    {
      VERIFY(tcgetattr(originalStdout, &originalTermios) == 0);
      originalTermiosValid = true;
      atexit(restoreTermMode);

      // get raw mode
      rawMode = originalTermios;
      cfmakeraw(&rawMode);
      rawMode.c_lflag |= ISIG;
      rawMode.c_cc[VMIN] = 1;
      rawMode.c_cc[VTIME] = 0;
      rawMode.c_oflag |= OPOST; // workaround for cygwin, TCSADRAIN does not seem to work reliably

      // disable input character echo
      noEchoMode = rawMode;
      noEchoMode.c_oflag |= OPOST;
      VERIFY(tcsetattr(originalStdout, TCSADRAIN, &noEchoMode) == 0);
    }

    // install console window resize signal handler
    if(!resizeEventFd)
    {
#ifdef __CYGWIN__
      int pipefd[2];
      VERIFY(pipe2(pipefd, O_CLOEXEC) == 0);
      resizeEventFd = pipefd[0];
      resizeEventFdWrite = pipefd[1];
#else
      resizeEventFd = eventfd(0, EFD_CLOEXEC);
#endif
      signal(SIGWINCH, handleWinch);
    }

    // utf8 console?
    utf8 = Process::getEnvironmentVariable("LANG").endsWith(".UTF-8"); // todo: endsWithNoCase?
#endif

    // get screen width
    stdoutScreenWidth = getScreenWidth();
  }